

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

sunrealtype N_VMinQuotient_Serial(N_Vector num,N_Vector denom)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  sunrealtype sVar5;
  sunrealtype sVar6;
  double dVar7;
  
  lVar3 = *num->content;
  lVar4 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  bVar1 = true;
  sVar5 = 1.79769313486232e+308;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    dVar7 = *(double *)(*(long *)((long)denom->content + 0x10) + lVar4 * 8);
    if ((dVar7 != 0.0) || (sVar6 = sVar5, NAN(dVar7))) {
      dVar7 = *(double *)(*(long *)((long)num->content + 0x10) + lVar4 * 8) / dVar7;
      bVar2 = !bVar1;
      sVar6 = dVar7;
      bVar1 = false;
      if ((bVar2) && (sVar6 = sVar5, dVar7 <= sVar5)) {
        sVar6 = dVar7;
        bVar1 = false;
      }
    }
    sVar5 = sVar6;
  }
  return sVar5;
}

Assistant:

sunrealtype N_VMinQuotient_Serial(N_Vector num, N_Vector denom)
{
  sunbooleantype notEvenOnce;
  sunindextype i, N;
  sunrealtype *nd, *dd, min;

  nd = dd = NULL;

  N  = NV_LENGTH_S(num);
  nd = NV_DATA_S(num);
  dd = NV_DATA_S(denom);

  notEvenOnce = SUNTRUE;
  min         = SUN_BIG_REAL;

  for (i = 0; i < N; i++)
  {
    if (dd[i] == ZERO) { continue; }
    else
    {
      if (!notEvenOnce) { min = SUNMIN(min, nd[i] / dd[i]); }
      else
      {
        min         = nd[i] / dd[i];
        notEvenOnce = SUNFALSE;
      }
    }
  }

  return (min);
}